

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

void __thiscall libtorrent::settings_pack::clear(settings_pack *this)

{
  settings_pack *this_local;
  
  ::std::
  vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->m_strings);
  ::std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>::
  clear(&this->m_ints);
  ::std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ::clear(&this->m_bools);
  return;
}

Assistant:

void settings_pack::clear()
	{
		m_strings.clear();
		m_ints.clear();
		m_bools.clear();
	}